

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathCheckCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  byte local_2aa;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined4 local_1fc;
  string local_1f8;
  undefined1 local_1d8 [8];
  ostringstream e;
  uint local_50;
  int local_4c;
  uint i;
  Doing doing;
  char *rpath;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&rpath);
  _i = (char *)0x0;
  local_4c = 0;
  local_50 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)file.field_2._8_8_);
    if (sVar2 <= local_50) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        if (_i == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"RPATH_CHECK not given RPATH option.",&local_249);
          cmCommand::SetError(&this->super_cmCommand,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          this_local._7_1_ = false;
          local_1fc = 1;
        }
        else {
          bVar1 = cmsys::SystemTools::FileExists((string *)&rpath,true);
          local_2aa = 0;
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,_i,&local_271);
            bVar1 = cmSystemTools::CheckRPath((string *)&rpath,&local_270);
            local_2aa = bVar1 ^ 0xff;
            std::__cxx11::string::~string((string *)&local_270);
            std::allocator<char>::~allocator(&local_271);
          }
          if ((local_2aa & 1) != 0) {
            cmsys::SystemTools::RemoveFile((string *)&rpath);
          }
          this_local._7_1_ = true;
          local_1fc = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,"RPATH_CHECK not given FILE option.",&local_221);
        cmCommand::SetError(&this->super_cmCommand,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
        this_local._7_1_ = false;
        local_1fc = 1;
      }
LAB_0029de90:
      std::__cxx11::string::~string((string *)&rpath);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)file.field_2._8_8_,(ulong)local_50);
    bVar1 = std::operator==(pvVar3,"RPATH");
    if (bVar1) {
      local_4c = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file.field_2._8_8_,(ulong)local_50);
      bVar1 = std::operator==(pvVar3,"FILE");
      if (bVar1) {
        local_4c = 1;
      }
      else {
        if (local_4c == 1) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)file.field_2._8_8_,(ulong)local_50);
          std::__cxx11::string::operator=((string *)&rpath,(string *)pvVar3);
        }
        else {
          if (local_4c != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            poVar4 = std::operator<<((ostream *)local_1d8,"RPATH_CHECK given unknown argument ");
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)file.field_2._8_8_,(ulong)local_50);
            std::operator<<(poVar4,(string *)pvVar3);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1f8);
            std::__cxx11::string::~string((string *)&local_1f8);
            this_local._7_1_ = false;
            local_1fc = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            goto LAB_0029de90;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)file.field_2._8_8_,(ulong)local_50);
          _i = (char *)std::__cxx11::string::c_str();
        }
        local_4c = 0;
      }
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathCheckCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* rpath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingRPath
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "RPATH") {
      doing = DoingRPath;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingRPath) {
      rpath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHECK given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHECK not given FILE option.");
    return false;
  }
  if (!rpath) {
    this->SetError("RPATH_CHECK not given RPATH option.");
    return false;
  }

  // If the file exists but does not have the desired RPath then
  // delete it.  This is used during installation to re-install a file
  // if its RPath will change.
  if (cmSystemTools::FileExists(file, true) &&
      !cmSystemTools::CheckRPath(file, rpath)) {
    cmSystemTools::RemoveFile(file);
  }

  return true;
}